

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_undo(nk_text_edit *state)

{
  undefined4 uVar1;
  undefined4 pos;
  undefined2 uVar2;
  undefined2 uVar3;
  nk_rune nVar4;
  nk_text_undo_state *state_00;
  nk_text_undo_record *pnVar5;
  int iVar6;
  int local_34;
  int i;
  nk_text_undo_record *r;
  short sStack_20;
  short sStack_1e;
  nk_text_undo_record u;
  nk_text_undo_state *s;
  nk_text_edit *state_local;
  
  state_00 = &state->undo;
  if ((state->undo).undo_point != 0) {
    pnVar5 = state_00->undo_rec + ((state->undo).undo_point + -1);
    pos = pnVar5->where;
    uVar2 = pnVar5->insert_length;
    uVar3 = pnVar5->delete_length;
    uVar1 = *(undefined4 *)&pnVar5->char_storage;
    pnVar5 = state_00->undo_rec + ((state->undo).redo_point + -1);
    pnVar5->char_storage = -1;
    pnVar5->insert_length = uVar3;
    pnVar5->delete_length = uVar2;
    pnVar5->where = pos;
    if (uVar3 != 0) {
      if ((int)(state->undo).undo_char_point + (int)(short)uVar3 < 999) {
        while ((int)(state->undo).redo_char_point <
               (int)(state->undo).undo_char_point + (int)(short)uVar3) {
          nk_textedit_discard_redo(state_00);
          if ((state->undo).redo_point == 99) {
            return;
          }
        }
        iVar6 = (state->undo).redo_point + -1;
        state_00->undo_rec[iVar6].char_storage = (state->undo).redo_char_point - uVar3;
        (state->undo).redo_char_point = (state->undo).redo_char_point - uVar3;
        for (local_34 = 0; local_34 < (short)uVar3; local_34 = local_34 + 1) {
          nVar4 = nk_str_rune_at(&state->string,pos + local_34);
          (state->undo).undo_char[state_00->undo_rec[iVar6].char_storage + local_34] = nVar4;
        }
      }
      else {
        pnVar5->insert_length = 0;
      }
      nk_str_delete_runes(&state->string,pos,(int)(short)uVar3);
    }
    if (uVar2 != 0) {
      u.where._0_2_ = (short)uVar1;
      nk_str_insert_text_runes
                (&state->string,pos,(state->undo).undo_char + (short)u.where,(int)(short)uVar2);
      (state->undo).undo_char_point = (state->undo).undo_char_point - uVar2;
    }
    state->cursor = (int)(short)((short)pos + uVar2);
    (state->undo).undo_point = (state->undo).undo_point + -1;
    (state->undo).redo_point = (state->undo).redo_point + -1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_undo(struct nk_text_edit *state)
{
    struct nk_text_undo_state *s = &state->undo;
    struct nk_text_undo_record u, *r;
    if (s->undo_point == 0)
        return;

    /* we need to do two things: apply the undo record, and create a redo record */
    u = s->undo_rec[s->undo_point-1];
    r = &s->undo_rec[s->redo_point-1];
    r->char_storage = -1;

    r->insert_length = u.delete_length;
    r->delete_length = u.insert_length;
    r->where = u.where;

    if (u.delete_length)
    {
       /*   if the undo record says to delete characters, then the redo record will
            need to re-insert the characters that get deleted, so we need to store
            them.
            there are three cases:
                - there's enough room to store the characters
                - characters stored for *redoing* don't leave room for redo
                - characters stored for *undoing* don't leave room for redo
            if the last is true, we have to bail */
        if (s->undo_char_point + u.delete_length >= NK_TEXTEDIT_UNDOCHARCOUNT) {
            /* the undo records take up too much character space; there's no space
            * to store the redo characters */
            r->insert_length = 0;
        } else {
            int i;
            /* there's definitely room to store the characters eventually */
            while (s->undo_char_point + u.delete_length > s->redo_char_point) {
                /* there's currently not enough room, so discard a redo record */
                nk_textedit_discard_redo(s);
                /* should never happen: */
                if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
                    return;
            }

            r = &s->undo_rec[s->redo_point-1];
            r->char_storage = (short)(s->redo_char_point - u.delete_length);
            s->redo_char_point = (short)(s->redo_char_point -  u.delete_length);

            /* now save the characters */
            for (i=0; i < u.delete_length; ++i)
                s->undo_char[r->char_storage + i] =
                    nk_str_rune_at(&state->string, u.where + i);
        }
        /* now we can carry out the deletion */
        nk_str_delete_runes(&state->string, u.where, u.delete_length);
    }

    /* check type of recorded action: */
    if (u.insert_length) {
        /* easy case: was a deletion, so we need to insert n characters */
        nk_str_insert_text_runes(&state->string, u.where,
            &s->undo_char[u.char_storage], u.insert_length);
        s->undo_char_point = (short)(s->undo_char_point - u.insert_length);
    }
    state->cursor = (short)(u.where + u.insert_length);

    s->undo_point--;
    s->redo_point--;
}